

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::Frame::Frame
          (Frame *this,Ref func,u32 values,u32 exceptions,u32 offset,Instance *inst,Module *mod)

{
  Instance *inst_local;
  u32 offset_local;
  u32 exceptions_local;
  u32 values_local;
  Frame *this_local;
  Ref func_local;
  
  (this->func).index = func.index;
  this->values = values;
  this->exceptions = exceptions;
  this->offset = offset;
  this->inst = inst;
  this->mod = mod;
  return;
}

Assistant:

inline Frame::Frame(Ref func,
                    u32 values,
                    u32 exceptions,
                    u32 offset,
                    Instance* inst,
                    Module* mod)
    : func(func),
      values(values),
      exceptions(exceptions),
      offset(offset),
      inst(inst),
      mod(mod) {}